

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O0

void toktleach(toktdef *tab1,_func_void_void_ptr_toksdef_ptr *cb,void *ctx)

{
  size_t sVar1;
  undefined8 in_RDX;
  code *in_RSI;
  long in_RDI;
  toktldef *tab;
  uint cnt;
  toksdef *p;
  undefined4 local_24;
  undefined8 local_20;
  
  local_20 = *(long *)(in_RDI + 0x30);
  for (local_24 = *(int *)(in_RDI + 0x40); local_24 != 0; local_24 = local_24 + -1) {
    (*in_RSI)(in_RDX,local_20);
    sVar1 = osrndsz((ulong)*(byte *)(local_20 + 6) + 8);
    local_20 = local_20 + sVar1;
  }
  return;
}

Assistant:

void toktleach(toktdef *tab1,
               void (*cb)(void *ctx, toksdef *sym), void *ctx)
{
    toksdef  *p;
    uint      cnt;
    toktldef *tab = (toktldef *)tab1;
    
    for (p = (toksdef *)tab->toktlptr, cnt = tab->toktlcnt ; cnt ; --cnt )
    {
        (*cb)(ctx, p);
        p = (toksdef *)(((uchar *)p)
                        + osrndsz(p->tokslen + sizeof(toks1def)));
    }
}